

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O0

void __thiscall
wasm::OptimizationOptions::OptimizationOptions
          (OptimizationOptions *this,string *command,string *description)

{
  bool bVar1;
  string *psVar2;
  undefined8 uVar3;
  string local_1480 [32];
  anon_class_40_2_fd512ddd local_1460;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1438;
  allocator<char> local_1411;
  string local_1410 [32];
  string local_13f0 [32];
  string local_13d0 [39];
  allocator<char> local_13a9;
  string local_13a8 [39];
  allocator<char> local_1381;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1360;
  reference local_1340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1300;
  allocator<char> local_12d9;
  string local_12d8 [39];
  allocator<char> local_12b1;
  string local_12b0 [39];
  allocator<char> local_1289;
  string local_1288 [39];
  allocator<char> local_1261;
  string local_1260 [32];
  anon_class_8_1_8991fb9c local_1240;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1238;
  allocator<char> local_1211;
  string local_1210 [39];
  allocator<char> local_11e9;
  string local_11e8 [39];
  allocator<char> local_11c1;
  string local_11c0 [39];
  allocator<char> local_1199;
  string local_1198 [32];
  anon_class_8_1_8991fb9c local_1178;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1170;
  allocator<char> local_1149;
  string local_1148 [39];
  allocator<char> local_1121;
  string local_1120 [39];
  allocator<char> local_10f9;
  string local_10f8 [39];
  allocator<char> local_10d1;
  string local_10d0 [32];
  anon_class_8_1_8991fb9c local_10b0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_10a8;
  allocator<char> local_1081;
  string local_1080 [39];
  allocator<char> local_1059;
  string local_1058 [39];
  allocator<char> local_1031;
  string local_1030 [39];
  allocator<char> local_1009;
  string local_1008 [32];
  anon_class_8_1_8991fb9c local_fe8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_fe0;
  allocator<char> local_fb9;
  string local_fb8 [39];
  allocator<char> local_f91;
  string local_f90 [39];
  allocator<char> local_f69;
  string local_f68 [39];
  allocator<char> local_f41;
  string local_f40 [32];
  anon_class_8_1_8991fb9c local_f20;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f18;
  allocator<char> local_ef1;
  string local_ef0 [39];
  allocator<char> local_ec9;
  string local_ec8 [39];
  allocator<char> local_ea1;
  string local_ea0 [39];
  allocator<char> local_e79;
  string local_e78 [32];
  anon_class_8_1_8991fb9c local_e58;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_e50;
  allocator<char> local_e29;
  string local_e28 [32];
  InliningOptions local_e08;
  string local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  allocator<char> local_d81;
  string local_d80 [39];
  allocator<char> local_d59;
  string local_d58 [32];
  anon_class_8_1_8991fb9c local_d38;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_d30;
  allocator<char> local_d09;
  string local_d08 [39];
  allocator<char> local_ce1;
  string local_ce0 [39];
  allocator<char> local_cb9;
  string local_cb8 [39];
  allocator<char> local_c91;
  string local_c90 [32];
  anon_class_8_1_8991fb9c local_c70;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c68;
  allocator<char> local_c41;
  string local_c40 [39];
  allocator<char> local_c19;
  string local_c18 [39];
  allocator<char> local_bf1;
  string local_bf0 [39];
  allocator<char> local_bc9;
  string local_bc8 [32];
  anon_class_8_1_8991fb9c local_ba8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ba0;
  allocator<char> local_b79;
  string local_b78 [32];
  InliningOptions local_b58;
  string local_b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  allocator<char> local_af1;
  string local_af0 [39];
  allocator<char> local_ac9;
  string local_ac8 [32];
  anon_class_8_1_8991fb9c local_aa8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_aa0;
  allocator<char> local_a79;
  string local_a78 [32];
  InliningOptions local_a58;
  string local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  allocator<char> local_9d9;
  string local_9d8 [39];
  allocator<char> local_9b1;
  string local_9b0 [32];
  anon_class_8_1_8991fb9c local_990;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_988;
  allocator<char> local_961;
  string local_960 [39];
  allocator<char> local_939;
  string local_938 [39];
  allocator<char> local_911;
  string local_910 [39];
  allocator<char> local_8e9;
  string local_8e8 [32];
  anon_class_8_1_8991fb9c local_8c8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_8c0;
  allocator<char> local_899;
  string local_898 [39];
  allocator<char> local_871;
  string local_870 [39];
  allocator<char> local_849;
  string local_848 [39];
  allocator<char> local_821;
  string local_820 [32];
  anon_class_8_1_8991fb9c local_800;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7f8;
  allocator<char> local_7d1;
  string local_7d0 [39];
  allocator<char> local_7a9;
  string local_7a8 [39];
  allocator<char> local_781;
  string local_780 [39];
  allocator<char> local_759;
  string local_758 [32];
  anon_class_8_1_8991fb9c local_738;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_730;
  allocator<char> local_709;
  string local_708 [39];
  allocator<char> local_6e1;
  string local_6e0 [39];
  allocator<char> local_6b9;
  string local_6b8 [39];
  allocator<char> local_691;
  string local_690 [32];
  anon_class_8_1_8991fb9c local_670;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_668;
  allocator<char> local_641;
  string local_640 [39];
  allocator<char> local_619;
  string local_618 [39];
  allocator<char> local_5f1;
  string local_5f0 [39];
  allocator<char> local_5c9;
  string local_5c8 [32];
  anon_class_8_1_8991fb9c local_5a8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5a0;
  allocator<char> local_579;
  string local_578 [39];
  allocator<char> local_551;
  string local_550 [39];
  allocator<char> local_529;
  string local_528 [39];
  allocator<char> local_501;
  string local_500 [32];
  anon_class_8_1_8991fb9c local_4e0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4d8;
  allocator<char> local_4b1;
  string local_4b0 [39];
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [39];
  allocator<char> local_439;
  string local_438 [32];
  anon_class_8_1_8991fb9c local_418;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_410;
  allocator<char> local_3e9;
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [32];
  anon_class_8_1_8991fb9c local_350;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_348;
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [32];
  anon_class_8_1_8991fb9c local_288;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_280;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  anon_class_8_1_8991fb9c local_1c0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  anon_class_8_1_8991fb9c local_f8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  string *local_20;
  string *description_local;
  string *command_local;
  OptimizationOptions *this_local;
  
  local_20 = description;
  description_local = command;
  command_local = (string *)this;
  ToolOptions::ToolOptions(&this->super_ToolOptions,command,description);
  (this->super_ToolOptions)._vptr_ToolOptions = (_func_int **)&PTR_addPassArg_001dab88;
  this->allowStackIR = true;
  std::
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ::vector(&this->passes);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"-O",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"execute default optimization passes (equivalent to -Os)",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"Optimization options",&local_c9);
  local_f8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_1_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f0,&local_f8);
  psVar2 = (string *)
           wasm::Options::add((string *)&(this->super_ToolOptions).super_Options,local_40,local_78,
                              local_a0,(Arguments)local_c8,(function *)0x0,SUB81(&local_f0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"-O0",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"execute no optimization passes",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"Optimization options",&local_191);
  local_1c0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_2_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1b8,&local_1c0);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_118,local_140,local_168,(Arguments)local_190,
                              (function *)0x0,SUB81(&local_1b8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"-O1",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,
             "execute -O1 optimization passes (quick&useful opts, useful for iteration builds)",
             &local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"Optimization options",&local_259);
  local_288.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_3_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_280,&local_288);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_1e0,local_208,local_230,(Arguments)local_258,
                              (function *)0x0,SUB81(&local_280,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"-O2",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"execute -O2 optimization passes (most opts, generally gets most perf)",
             &local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"Optimization options",&local_321);
  local_350.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_4_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_348,&local_350);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_2a8,local_2d0,local_2f8,(Arguments)local_320,
                              (function *)0x0,SUB81(&local_348,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"-O3",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,
             "execute -O3 optimization passes (spends potentially a lot of time optimizing)",
             &local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"Optimization options",&local_3e9);
  local_418.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_5_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_410,&local_418);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_370,local_398,local_3c0,(Arguments)local_3e8,
                              (function *)0x0,SUB81(&local_410,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"-O4",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_488,
             "execute -O4 optimization passes (also flatten the IR, which can take a lot more time and memory, but is useful on more nested / complex / less-optimized input)"
             ,&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,"Optimization options",&local_4b1);
  local_4e0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_6_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4d8,&local_4e0);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_438,local_460,local_488,(Arguments)local_4b0,
                              (function *)0x0,SUB81(&local_4d8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"",&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_528,"-Os",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_550,"execute default optimization passes, focusing on code size",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_578,"Optimization options",&local_579);
  local_5a8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_7_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_5a0,&local_5a8);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_500,local_528,local_550,(Arguments)local_578,
                              (function *)0x0,SUB81(&local_5a0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"",&local_5c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5f0,"-Oz",&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_618,"execute default optimization passes, super-focusing on code size",&local_619
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_640,"Optimization options",&local_641);
  local_670.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_8_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_668,&local_670);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_5c8,local_5f0,local_618,(Arguments)local_640,
                              (function *)0x0,SUB81(&local_668,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_690,"--optimize-level",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"-ol",&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"How much to focus on optimizing code",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_708,"Optimization options",&local_709);
  local_738.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_9_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_730,&local_738);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_690,local_6b8,local_6e0,(Arguments)local_708,
                              (function *)0x1,SUB81(&local_730,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"--shrink-level",&local_759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_780,"-s",&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a8,"How much to focus on shrinking code size",&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,"Optimization options",&local_7d1);
  local_800.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_10_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_7f8,&local_800);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_758,local_780,local_7a8,(Arguments)local_7d0,
                              (function *)0x1,SUB81(&local_7f8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_820,"--debuginfo",&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_848,"-g",&local_849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_870,"Emit names section in wasm binary (or full debuginfo in wast)",&local_871);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_898,"Optimization options",&local_899);
  local_8c8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_11_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_8c0,&local_8c8);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_820,local_848,local_870,(Arguments)local_898,
                              (function *)0x0,SUB81(&local_8c0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8e8,"--no-stack-ir",&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_910,"",&local_911);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_938,"do not use StackIR (even when it is the default)",&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_960,"Tool options",&local_961);
  local_990.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_12_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_988,&local_990);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_8e8,local_910,local_938,(Arguments)local_960,
                              (function *)0x0,SUB81(&local_988,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9b0,"--always-inline-max-function-size",&local_9b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9d8,"-aimfs",&local_9d9);
  local_a58.alwaysInlineMaxSize = 0;
  local_a58.oneCallerInlineMaxSize = 0;
  local_a58.flexibleInlineMaxSize = 0;
  local_a58.allowFunctionsWithLoops = false;
  local_a58._13_3_ = 0;
  local_a58.partialInliningIfs = 0;
  InliningOptions::InliningOptions(&local_a58);
  std::__cxx11::to_string(&local_a40,2);
  std::operator+(&local_a20,"Max size of functions that are always inlined (default ",&local_a40);
  std::operator+(&local_a00,&local_a20,", which is safe for use with -Os builds)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a78,"Optimization options",&local_a79);
  local_aa8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_13_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_aa0,&local_aa8);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_9b0,local_9d8,(string *)&local_a00,(Arguments)local_a78,
                              (function *)0x1,SUB81(&local_aa0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ac8,"--flexible-inline-max-function-size",&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_af0,"-fimfs",&local_af1);
  local_b58.alwaysInlineMaxSize = 0;
  local_b58.oneCallerInlineMaxSize = 0;
  local_b58.flexibleInlineMaxSize = 0;
  local_b58.allowFunctionsWithLoops = false;
  local_b58._13_3_ = 0;
  local_b58.partialInliningIfs = 0;
  InliningOptions::InliningOptions(&local_b58);
  std::__cxx11::to_string(&local_b38,0x14);
  std::operator+(&local_b18,
                 "Max size of functions that are inlined when lightweight (no loops or function calls) when optimizing aggressively for speed (-O3). Default: "
                 ,&local_b38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b78,"Optimization options",&local_b79);
  local_ba8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_14_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_ba0,&local_ba8);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_ac8,local_af0,(string *)&local_b18,(Arguments)local_b78,
                              (function *)0x1,SUB81(&local_ba0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_bc8,"--one-caller-inline-max-function-size",&local_bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bf0,"-ocimfs",&local_bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c18,
             "Max size of functions that are inlined when there is only one caller (default -1, which means all such functions are inlined)"
             ,&local_c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c40,"Optimization options",&local_c41);
  local_c70.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_15_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_c68,&local_c70);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_bc8,local_bf0,local_c18,(Arguments)local_c40,
                              (function *)0x1,SUB81(&local_c68,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c90,"--inline-functions-with-loops",&local_c91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_cb8,"-ifwl",&local_cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ce0,"Allow inlining functions with loops",&local_ce1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d08,"Optimization options",&local_d09);
  local_d38.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_16_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_d30,&local_d38);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_c90,local_cb8,local_ce0,(Arguments)local_d08,
                              (function *)0x0,SUB81(&local_d30,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d58,"--partial-inlining-ifs",&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d80,"-pii",&local_d81);
  local_e08.alwaysInlineMaxSize = 0;
  local_e08.oneCallerInlineMaxSize = 0;
  local_e08.flexibleInlineMaxSize = 0;
  local_e08.allowFunctionsWithLoops = false;
  local_e08._13_3_ = 0;
  local_e08.partialInliningIfs = 0;
  InliningOptions::InliningOptions(&local_e08);
  std::__cxx11::to_string(&local_de8,0);
  std::operator+(&local_dc8,
                 "Number of ifs allowed in partial inlining (zero means partial inlining is disabled) (default: "
                 ,&local_de8);
  std::operator+(&local_da8,&local_dc8,')');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e28,"Optimization options",&local_e29);
  local_e58.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_17_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_e50,&local_e58);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_d58,local_d80,(string *)&local_da8,(Arguments)local_e28,
                              (function *)0x1,SUB81(&local_e50,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e78,"--ignore-implicit-traps",&local_e79)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ea0,"-iit",&local_ea1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ec8,
             "Optimize under the helpful assumption that no surprising traps occur (from load, div/mod, etc.)"
             ,&local_ec9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ef0,"Optimization options",&local_ef1);
  local_f20.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_18_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f18,&local_f20);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_e78,local_ea0,local_ec8,(Arguments)local_ef0,
                              (function *)0x0,SUB81(&local_f18,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f40,"--traps-never-happen",&local_f41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f68,"-tnh",&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f90,
             "Optimize under the helpful assumption that no trap is reached at runtime (from load, div/mod, etc.)"
             ,&local_f91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_fb8,"Optimization options",&local_fb9);
  local_fe8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_19_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_fe0,&local_fe8);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_f40,local_f68,local_f90,(Arguments)local_fb8,
                              (function *)0x0,SUB81(&local_fe0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1008,"--low-memory-unused",&local_1009);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1030,"-lmu",&local_1031);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1058,
             "Optimize under the helpful assumption that the low 1K of memory is not used by the application"
             ,&local_1059);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1080,"Optimization options",&local_1081);
  local_10b0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_20_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_10a8,&local_10b0);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_1008,local_1030,local_1058,(Arguments)local_1080,
                              (function *)0x0,SUB81(&local_10a8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_10d0,"--fast-math",&local_10d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_10f8,"-ffm",&local_10f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1120,"Optimize floats without handling corner cases of NaNs and rounding",
             &local_1121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1148,"Optimization options",&local_1149);
  local_1178.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_21_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1170,&local_1178);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_10d0,local_10f8,local_1120,(Arguments)local_1148,
                              (function *)0x0,SUB81(&local_1170,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1198,"--zero-filled-memory",&local_1199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11c0,"-uim",&local_11c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_11e8,"Assume that an imported memory will be zero-initialized",&local_11e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1210,"Optimization options",&local_1211);
  local_1240.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_22_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1238,&local_1240);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_1198,local_11c0,local_11e8,(Arguments)local_1210,
                              (function *)0x0,SUB81(&local_1238,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1260,"--skip-pass",&local_1261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1288,"-sp",&local_1289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_12b0,"Skip a pass (do not run it)",&local_12b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_12d8,"Optimization options",&local_12d9);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_23_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1300,
             (anon_class_8_1_8991fb9c *)&__range2);
  wasm::Options::add(psVar2,local_1260,local_1288,local_12b0,(Arguments)local_12d8,(function *)0x2,
                     false);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1300);
  std::__cxx11::string::~string(local_12d8);
  std::allocator<char>::~allocator(&local_12d9);
  std::__cxx11::string::~string(local_12b0);
  std::allocator<char>::~allocator(&local_12b1);
  std::__cxx11::string::~string(local_1288);
  std::allocator<char>::~allocator(&local_1289);
  std::__cxx11::string::~string(local_1260);
  std::allocator<char>::~allocator(&local_1261);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1238);
  std::__cxx11::string::~string(local_1210);
  std::allocator<char>::~allocator(&local_1211);
  std::__cxx11::string::~string(local_11e8);
  std::allocator<char>::~allocator(&local_11e9);
  std::__cxx11::string::~string(local_11c0);
  std::allocator<char>::~allocator(&local_11c1);
  std::__cxx11::string::~string(local_1198);
  std::allocator<char>::~allocator(&local_1199);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1170);
  std::__cxx11::string::~string(local_1148);
  std::allocator<char>::~allocator(&local_1149);
  std::__cxx11::string::~string(local_1120);
  std::allocator<char>::~allocator(&local_1121);
  std::__cxx11::string::~string(local_10f8);
  std::allocator<char>::~allocator(&local_10f9);
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator(&local_10d1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_10a8);
  std::__cxx11::string::~string(local_1080);
  std::allocator<char>::~allocator(&local_1081);
  std::__cxx11::string::~string(local_1058);
  std::allocator<char>::~allocator(&local_1059);
  std::__cxx11::string::~string(local_1030);
  std::allocator<char>::~allocator(&local_1031);
  std::__cxx11::string::~string(local_1008);
  std::allocator<char>::~allocator(&local_1009);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_fe0);
  std::__cxx11::string::~string(local_fb8);
  std::allocator<char>::~allocator(&local_fb9);
  std::__cxx11::string::~string(local_f90);
  std::allocator<char>::~allocator(&local_f91);
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator(&local_f69);
  std::__cxx11::string::~string(local_f40);
  std::allocator<char>::~allocator(&local_f41);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f18);
  std::__cxx11::string::~string(local_ef0);
  std::allocator<char>::~allocator(&local_ef1);
  std::__cxx11::string::~string(local_ec8);
  std::allocator<char>::~allocator(&local_ec9);
  std::__cxx11::string::~string(local_ea0);
  std::allocator<char>::~allocator(&local_ea1);
  std::__cxx11::string::~string(local_e78);
  std::allocator<char>::~allocator(&local_e79);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_e50);
  std::__cxx11::string::~string(local_e28);
  std::allocator<char>::~allocator(&local_e29);
  std::__cxx11::string::~string((string *)&local_da8);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::~string((string *)&local_de8);
  std::__cxx11::string::~string(local_d80);
  std::allocator<char>::~allocator(&local_d81);
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator(&local_d59);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_d30);
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator(&local_d09);
  std::__cxx11::string::~string(local_ce0);
  std::allocator<char>::~allocator(&local_ce1);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator(&local_cb9);
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::~allocator(&local_c91);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c68);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator(&local_c41);
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator(&local_c19);
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator(&local_bf1);
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_ba0);
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator(&local_b79);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator(&local_af1);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator(&local_ac9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_aa0);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator(&local_a79);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator(&local_9d9);
  std::__cxx11::string::~string(local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_988);
  std::__cxx11::string::~string(local_960);
  std::allocator<char>::~allocator(&local_961);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator(&local_939);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator(&local_911);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_8c0);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator(&local_899);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator(&local_871);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator(&local_821);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_7f8);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator(&local_781);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_759);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_730);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator(&local_691);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_668);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5a0);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_579);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_501);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4d8);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_410);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_348);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_280);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  wasm::PassRegistry::get();
  wasm::PassRegistry::getRegisteredNames_abi_cxx11_();
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin2);
  p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&p);
    if (!bVar1) break;
    local_1340 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1380,"--",&local_1381);
    std::operator+(&local_1360,&local_1380,local_1340);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_13a8,"",&local_13a9);
    uVar3 = wasm::PassRegistry::get();
    std::__cxx11::string::string(local_13f0,(string *)local_1340);
    wasm::PassRegistry::getPassDescription(local_13d0,uVar3,local_13f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1410,"Optimization passes",&local_1411)
    ;
    local_1460.this = this;
    std::__cxx11::string::string((string *)&local_1460.p,(string *)local_1340);
    std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
    function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_24_,void>
              ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1438,&local_1460
              );
    uVar3 = wasm::PassRegistry::get();
    std::__cxx11::string::string(local_1480,(string *)local_1340);
    wasm::PassRegistry::isPassHidden(uVar3,local_1480);
    wasm::Options::add((string *)&(this->super_ToolOptions).super_Options,(string *)&local_1360,
                       local_13a8,local_13d0,(Arguments)local_1410,(function *)0x3,
                       SUB81(&local_1438,0));
    std::__cxx11::string::~string(local_1480);
    std::
    function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_1438);
    OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::
    {lambda(wasm::Options*,std::__cxx11::string_const&)#24}::~Options
              ((_lambda_wasm__Options__std____cxx11__string_const___24_ *)&local_1460);
    std::__cxx11::string::~string(local_1410);
    std::allocator<char>::~allocator(&local_1411);
    std::__cxx11::string::~string(local_13d0);
    std::__cxx11::string::~string(local_13f0);
    std::__cxx11::string::~string(local_13a8);
    std::allocator<char>::~allocator(&local_13a9);
    std::__cxx11::string::~string((string *)&local_1360);
    std::__cxx11::string::~string((string *)&local_1380);
    std::allocator<char>::~allocator(&local_1381);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin2);
  return;
}

Assistant:

OptimizationOptions(const std::string& command,
                      const std::string& description)
    : ToolOptions(command, description) {
    (*this)
      .add(
        "",
        "-O",
        "execute default optimization passes (equivalent to -Os)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.setDefaultOptimizationOptions();
          static_assert(
            PassOptions::DEFAULT_OPTIMIZE_LEVEL == OS_OPTIMIZE_LEVEL &&
              PassOptions::DEFAULT_SHRINK_LEVEL == OS_SHRINK_LEVEL,
            "Help text states that -O is equivalent to -Os but now it isn't.");
          addDefaultOptPasses();
        })
      .add("",
           "-O0",
           "execute no optimization passes",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 0;
             passOptions.shrinkLevel = 0;
           })
      .add("",
           "-O1",
           "execute -O1 optimization passes (quick&useful opts, useful for "
           "iteration builds)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 1;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add(
        "",
        "-O2",
        "execute -O2 optimization passes (most opts, generally gets most perf)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.optimizeLevel = 2;
          passOptions.shrinkLevel = 0;
          addDefaultOptPasses();
        })
      .add("",
           "-O3",
           "execute -O3 optimization passes (spends potentially a lot of time "
           "optimizing)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 3;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-O4",
           "execute -O4 optimization passes (also flatten the IR, which can "
           "take a lot more time and memory, but is useful on more nested / "
           "complex / less-optimized input)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 4;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-Os",
           "execute default optimization passes, focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = OS_OPTIMIZE_LEVEL;
             passOptions.shrinkLevel = OS_SHRINK_LEVEL;
             addDefaultOptPasses();
           })
      .add("",
           "-Oz",
           "execute default optimization passes, super-focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 2;
             passOptions.shrinkLevel = 2;
             addDefaultOptPasses();
           })
      .add("--optimize-level",
           "-ol",
           "How much to focus on optimizing code",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.optimizeLevel = atoi(argument.c_str());
           })
      .add("--shrink-level",
           "-s",
           "How much to focus on shrinking code size",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.shrinkLevel = atoi(argument.c_str());
           })
      .add("--debuginfo",
           "-g",
           "Emit names section in wasm binary (or full debuginfo in wast)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.debugInfo = true;
           })
      .add("--no-stack-ir",
           "",
           "do not use StackIR (even when it is the default)",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             allowStackIR = false;
             passOptions.generateStackIR = false;
             passOptions.optimizeStackIR = false;
           })
      .add("--always-inline-max-function-size",
           "-aimfs",
           "Max size of functions that are always inlined (default " +
             std::to_string(InliningOptions().alwaysInlineMaxSize) +
             ", which "
             "is safe for use with -Os builds)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.alwaysInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--flexible-inline-max-function-size",
           "-fimfs",
           "Max size of functions that are inlined when lightweight (no loops "
           "or function calls) when optimizing aggressively for speed (-O3). "
           "Default: " +
             std::to_string(InliningOptions().flexibleInlineMaxSize),
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.flexibleInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--one-caller-inline-max-function-size",
           "-ocimfs",
           "Max size of functions that are inlined when there is only one "
           "caller (default -1, which means all such functions are inlined)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             static_assert(InliningOptions().oneCallerInlineMaxSize ==
                             Index(-1),
                           "the help text here is written to assume -1");
             passOptions.inlining.oneCallerInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--inline-functions-with-loops",
           "-ifwl",
           "Allow inlining functions with loops",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string&) {
             passOptions.inlining.allowFunctionsWithLoops = true;
           })
      .add("--partial-inlining-ifs",
           "-pii",
           "Number of ifs allowed in partial inlining (zero means partial "
           "inlining is disabled) (default: " +
             std::to_string(InliningOptions().partialInliningIfs) + ')',
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.partialInliningIfs =
               static_cast<Index>(std::stoi(argument));
           })
      .add("--ignore-implicit-traps",
           "-iit",
           "Optimize under the helpful assumption that no surprising traps "
           "occur (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.ignoreImplicitTraps = true;
           })
      .add("--traps-never-happen",
           "-tnh",
           "Optimize under the helpful assumption that no trap is reached at "
           "runtime (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.trapsNeverHappen = true;
           })
      .add("--low-memory-unused",
           "-lmu",
           "Optimize under the helpful assumption that the low 1K of memory is "
           "not used by the application",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.lowMemoryUnused = true;
           })
      .add(
        "--fast-math",
        "-ffm",
        "Optimize floats without handling corner cases of NaNs and rounding",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) { passOptions.fastMath = true; })
      .add("--zero-filled-memory",
           "-uim",
           "Assume that an imported memory will be zero-initialized",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.zeroFilledMemory = true;
           })
      .add("--skip-pass",
           "-sp",
           "Skip a pass (do not run it)",
           OptimizationOptionsCategory,
           Options::Arguments::N,
           [this](Options*, const std::string& pass) {
             passOptions.passesToSkip.insert(pass);
           });

    // add passes in registry
    for (const auto& p : PassRegistry::get()->getRegisteredNames()) {
      (*this).add(
        std::string("--") + p,
        "",
        PassRegistry::get()->getPassDescription(p),
        "Optimization passes",
        // Allow an optional parameter to a pass. If provided, it is
        // the same as if using --pass-arg, that is,
        //
        //   --foo=ARG
        //
        // is the same as
        //
        //   --foo --pass-arg=foo@ARG
        Options::Arguments::Optional,
        [this, p](Options*, const std::string& arg) {
          PassInfo info(p);
          if (!arg.empty()) {
            info.argument = arg;
          }

          passes.push_back(info);
        },
        PassRegistry::get()->isPassHidden(p));
    }
  }